

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.h
# Opt level: O1

InlineeFrameInfo * InlineeFrameInfo::New(JitArenaAllocator *alloc)

{
  InlineeFrameInfo *pIVar1;
  ArgList *pAVar2;
  
  pIVar1 = (InlineeFrameInfo *)new<Memory::JitArenaAllocator>(0x50,alloc,0x425974);
  (pIVar1->function).type = InlineeFrameInfoValueType_None;
  (pIVar1->function).field_1.sym = (StackSym *)0x0;
  pAVar2 = (ArgList *)new<Memory::JitArenaAllocator>(0x30,alloc,0x3f1274);
  (pAVar2->super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pAVar2->super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
  count = 0;
  (pAVar2->super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (pAVar2->super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea648;
  pAVar2->length = 0;
  pAVar2->increment = 4;
  pIVar1->arguments = pAVar2;
  return pIVar1;
}

Assistant:

static InlineeFrameInfo* New(JitArenaAllocator* alloc)
    {
        InlineeFrameInfo* frameInfo = JitAnewStructZ(alloc, InlineeFrameInfo);
        frameInfo->arguments = JitAnew(alloc, ArgList, alloc);
        return frameInfo;
    }